

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc2b.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  string *this;
  _Alloc_hider _Var5;
  char *__s;
  size_type __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  int num_order;
  double alpha;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  vector<double,_std::allocator<double>_> mlsa_digital_filter_coefficients;
  vector<double,_std::allocator<double>_> mel_cepstrum;
  ostringstream error_message_4;
  ifstream ifs;
  int local_434 [3];
  double local_428;
  string local_420;
  undefined1 local_400 [32];
  vector<double,_std::allocator<double>_> local_3e0;
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_434[0] = 0x19;
  local_428 = 0.35;
  local_434[1] = 0;
  local_434[2] = 0;
  do {
    iVar3 = ya_getopt_long(argc,argv,"m:a:h",(option *)0x0,(int *)0x0);
    if (iVar3 < 0x68) {
      if (iVar3 == -1) {
        iVar3 = 2;
      }
      else {
        if (iVar3 == 0x61) {
          std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
          bVar1 = sptk::ConvertStringToDouble(&local_238,&local_428);
          if (bVar1) {
            bVar1 = sptk::IsValidAlpha(local_428);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != &local_238.field_2) {
              operator_delete(local_238._M_dataplus._M_p);
            }
            if (bVar1) {
              iVar3 = 0;
              goto LAB_0010399d;
            }
          }
          else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_238,"The argument for the -a option must be in (-1.0, 1.0)",
                     0x35);
          local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"mc2b","");
          sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_00103958:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
            operator_delete(local_3b0[0]._M_dataplus._M_p);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
          std::ios_base::~ios_base(local_1c8);
        }
        else {
LAB_00103831:
          anon_unknown.dwarf_2bd3::PrintUsage((ostream *)&std::cerr);
        }
        iVar3 = 1;
        local_434[1] = 1;
        local_434[2] = 0;
      }
    }
    else if (iVar3 == 0x68) {
      anon_unknown.dwarf_2bd3::PrintUsage((ostream *)&std::cout);
      local_434[1] = 0;
      local_434[2] = 0;
      iVar3 = 1;
    }
    else {
      if (iVar3 != 0x6d) goto LAB_00103831;
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar1 = sptk::ConvertStringToInteger(&local_238,local_434);
      bVar7 = local_434[0] < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar1 || bVar7) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"mc2b","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_00103958;
      }
      iVar3 = 0;
    }
LAB_0010399d:
  } while (iVar3 == 0);
  if (iVar3 != 2) {
    return (int)local_434._4_8_;
  }
  if (1 < argc - ya_optind) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"mc2b","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_00103b60:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    return 1;
  }
  if (argc == ya_optind) {
    __s = (char *)0x0;
  }
  else {
    __s = argv[ya_optind];
  }
  bVar1 = sptk::SetBinaryMode();
  this = &local_238;
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"mc2b","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    goto LAB_00103b60;
  }
  std::ifstream::ifstream(this);
  if ((__s == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      this = (string *)&std::cin;
    }
    sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
              ((MelCepstrumToMlsaDigitalFilterCoefficients *)local_400,local_434[0],local_428);
    if (local_400[0x18] != '\0') {
      __n = (long)local_434[0] + 1;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3c8,__n,(allocator_type *)local_3b0);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_3e0,__n,(allocator_type *)local_3b0);
      do {
        bVar1 = sptk::ReadStream<double>(false,0,0,(int)__n,&local_3c8,(istream *)this,(int *)0x0);
        if (!bVar1) {
          iVar3 = 0;
          goto LAB_00103e01;
        }
        bVar1 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
                          ((MelCepstrumToMlsaDigitalFilterCoefficients *)local_400,&local_3c8,
                           &local_3e0);
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,
                     "Failed to convert mel-cepstrum to MLSA digital filter coefficients",0x42);
          local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"mc2b","");
          sptk::PrintErrorMessage(&local_420,(ostringstream *)local_3b0);
          goto LAB_00103dcc;
        }
        bVar1 = sptk::WriteStream<double>(0,(int)__n,&local_3e0,(ostream *)&std::cout,(int *)0x0);
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Failed to write MLSA digital filter coefficients",0x30);
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"mc2b","");
      sptk::PrintErrorMessage(&local_420,(ostringstream *)local_3b0);
LAB_00103dcc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      iVar3 = 1;
LAB_00103e01:
      if (local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3e0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_00103e22;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,
               "Failed to initialize MelCepstrumToMlsaDigitalFilterCoefficients",0x3f);
    paVar6 = &local_420.field_2;
    local_420._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"mc2b","");
    sptk::PrintErrorMessage(&local_420,(ostringstream *)local_3b0);
    _Var5._M_p = local_420._M_dataplus._M_p;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Cannot open file ",0x11);
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar4);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_400 + 0x10);
    local_400._0_8_ = paVar6;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_400,"mc2b","");
    sptk::PrintErrorMessage((string *)local_400,(ostringstream *)local_3b0);
    _Var5._M_p = (pointer)local_400._0_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
  std::ios_base::~ios_base(local_340);
  iVar3 = 1;
LAB_00103e22:
  std::ifstream::~ifstream(&local_238);
  return iVar3;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:a:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mc2b", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mc2b", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize MelCepstrumToMlsaDigitalFilterCoefficients";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> mel_cepstrum(length);
  std::vector<double> mlsa_digital_filter_coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &mel_cepstrum, &input_stream,
                          NULL)) {
    if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(
            mel_cepstrum, &mlsa_digital_filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Failed to convert mel-cepstrum to MLSA digital "
                       "filter coefficients";
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, mlsa_digital_filter_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write MLSA digital filter coefficients";
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }
  }

  return 0;
}